

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveBuilder.h
# Opt level: O1

void __thiscall
ZAP::ArchiveBuilder::Entry::Entry(Entry *this,string *real_path,string *virtual_path)

{
  pointer pcVar1;
  
  (this->real_path)._M_dataplus._M_p = (pointer)&(this->real_path).field_2;
  pcVar1 = (real_path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + real_path->_M_string_length);
  (this->virtual_path)._M_dataplus._M_p = (pointer)&(this->virtual_path).field_2;
  pcVar1 = (virtual_path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->virtual_path,pcVar1,pcVar1 + virtual_path->_M_string_length);
  return;
}

Assistant:

Entry(const std::string &real_path, const std::string &virtual_path)
				: real_path(real_path), virtual_path(virtual_path) {}